

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibBase.cpp
# Opt level: O3

int lib::base::DoIPairs(State *state)

{
  bool bVar1;
  Table *this;
  int iVar2;
  double dVar3;
  Value VVar4;
  StackAPI api;
  anon_union_8_9_8deb4486_for_Value_0 local_48;
  ValueT local_40;
  StackAPI local_38;
  anon_union_8_9_8deb4486_for_Value_0 local_28;
  undefined4 local_20;
  
  luna::StackAPI::StackAPI(&local_38,state);
  bVar1 = luna::StackAPI::CheckArgs<luna::ValueT,luna::ValueT>
                    (&local_38,2,ValueT_Table,ValueT_Number);
  iVar2 = 0;
  if (bVar1) {
    iVar2 = 0;
    this = luna::StackAPI::GetTable(&local_38,0);
    dVar3 = luna::StackAPI::GetNumber(&local_38,1);
    local_28.num_ = dVar3 + 1.0;
    local_20 = 2;
    VVar4 = luna::Table::GetValue(this,(Value *)&local_28);
    local_48 = VVar4.field_0;
    local_40 = VVar4.type_;
    if (local_40 != ValueT_Nil) {
      luna::StackAPI::PushValue(&local_38,(Value *)&local_28);
      luna::StackAPI::PushValue(&local_38,(Value *)&local_48);
      iVar2 = 2;
    }
  }
  return iVar2;
}

Assistant:

int DoIPairs(luna::State *state)
    {
        luna::StackAPI api(state);
        if (!api.CheckArgs(2, luna::ValueT_Table, luna::ValueT_Number))
            return 0;

        luna::Table *t = api.GetTable(0);
        double num = api.GetNumber(1) + 1;

        luna::Value k;
        k.type_ = luna::ValueT_Number;
        k.num_ = num;
        luna::Value v = t->GetValue(k);

        if (v.type_ == luna::ValueT_Nil)
            return 0;

        api.PushValue(k);
        api.PushValue(v);
        return 2;
    }